

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256-ni.c
# Opt level: O0

void sha256_ni_write(BinarySink *bs,void *vp,size_t len)

{
  _Bool _Var1;
  sha256_ni *s;
  size_t len_local;
  void *vp_local;
  BinarySink *bs_local;
  
  s = (sha256_ni *)len;
  len_local = (size_t)vp;
  vp_local = bs;
  while (s != (sha256_ni *)0x0) {
    _Var1 = sha256_block_write((sha256_block *)&bs[-4].writefmtv,(void **)&len_local,(size_t *)&s);
    if (_Var1) {
      sha256_ni_block((__m128i *)(bs + -5),(uint8_t *)&bs[-4].writefmtv);
    }
  }
  return;
}

Assistant:

static void sha256_ni_write(BinarySink *bs, const void *vp, size_t len)
{
    sha256_ni *s = BinarySink_DOWNCAST(bs, sha256_ni);

    while (len > 0)
        if (sha256_block_write(&s->blk, &vp, &len))
            sha256_ni_block(s->core, s->blk.block);
}